

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O0

int StatLoop(VP8Encoder *enc)

{
  int iVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  long *in_RDI;
  uint64_t size_p0;
  int is_last_pass;
  PassStats stats;
  int nb_mbs;
  VP8RDLevel rd_opt;
  int final_percent;
  int percent_per_pass;
  int task_percent;
  int num_pass_left;
  int fast_probe;
  int do_search;
  int method;
  PassStats *in_stack_00001200;
  int in_stack_0000120c;
  int in_stack_00001210;
  VP8RDLevel in_stack_00001214;
  VP8Encoder *in_stack_00001218;
  int *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  uint uVar5;
  int in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  undefined2 in_stack_ffffffffffffff7c;
  undefined1 uVar6;
  byte bVar7;
  VP8Encoder *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  float in_stack_ffffffffffffff94;
  VP8EncProba *in_stack_ffffffffffffffa0;
  VP8EncProba *in_stack_ffffffffffffffb0;
  int local_40;
  int local_20;
  
  iVar4 = (int)in_RDI[0xb88];
  iVar1 = *(int *)((long)in_RDI + 0x5c54);
  if ((iVar4 == 0) || (bVar7 = 0, iVar4 == 3)) {
    bVar7 = iVar1 != 0 ^ 0xff;
  }
  bVar2 = bVar7 & 1;
  local_20 = *(int *)(*in_RDI + 0x3c);
  uVar6 = 2 < iVar4 || iVar1 != 0;
  iVar3 = (int)in_RDI[6] * *(int *)((long)in_RDI + 0x34);
  InitPassStats((VP8Encoder *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                (PassStats *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  ResetTokenStats((VP8Encoder *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  if (bVar2 != 0) {
    if (iVar4 == 3) {
      if (iVar3 < 0xc9) {
        in_stack_ffffffffffffff78 = 100;
      }
      else {
        in_stack_ffffffffffffff78 = iVar3 >> 1;
      }
    }
    else if (iVar3 < 0xc9) {
      in_stack_ffffffffffffff74 = 0x32;
    }
    else {
      in_stack_ffffffffffffff74 = iVar3 >> 2;
    }
  }
  while (iVar4 = local_20 + -1, 0 < local_20) {
    uVar5 = 0x1000000;
    if ((0.4 < ABS(in_stack_ffffffffffffff94)) && (uVar5 = 0x1000000, iVar4 != 0)) {
      uVar5 = (uint)((int)in_RDI[0xb89] == 0) << 0x18;
    }
    uVar5 = uVar5 >> 0x18;
    in_stack_ffffffffffffff80 =
         (VP8Encoder *)
         OneStatPass(in_stack_00001218,in_stack_00001214,in_stack_00001210,in_stack_0000120c,
                     in_stack_00001200);
    if (in_stack_ffffffffffffff80 == (VP8Encoder *)0x0) {
      return 0;
    }
    if (((int)in_RDI[0xb89] < 1) || (in_stack_ffffffffffffff80 < (VP8Encoder *)0x3fc00001)) {
      if ((uVar5 != 0) ||
         ((local_20 = iVar4, iVar1 != 0 &&
          (ComputeNextQ((PassStats *)in_stack_ffffffffffffff80),
          ABS(in_stack_ffffffffffffff94) <= 0.4)))) break;
    }
    else {
      *(int *)(in_RDI + 0xb89) = (int)in_RDI[0xb89] >> 1;
    }
  }
  if ((iVar1 == 0) || (local_40 == 0)) {
    FinalizeSkipProba(in_stack_ffffffffffffff80);
    FinalizeTokenProbas(in_stack_ffffffffffffffb0);
  }
  VP8CalculateLevelCosts(in_stack_ffffffffffffffa0);
  iVar4 = WebPReportProgress((WebPPicture *)
                             CONCAT17(bVar7,CONCAT16(uVar6,CONCAT24(in_stack_ffffffffffffff7c,
                                                                    in_stack_ffffffffffffff78))),
                             in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
  return iVar4;
}

Assistant:

static int StatLoop(VP8Encoder* const enc) {
  const int method = enc->method;
  const int do_search = enc->do_search;
  const int fast_probe = ((method == 0 || method == 3) && !do_search);
  int num_pass_left = enc->config->pass;
  const int task_percent = 20;
  const int percent_per_pass =
      (task_percent + num_pass_left / 2) / num_pass_left;
  const int final_percent = enc->percent + task_percent;
  const VP8RDLevel rd_opt =
      (method >= 3 || do_search) ? RD_OPT_BASIC : RD_OPT_NONE;
  int nb_mbs = enc->mb_w * enc->mb_h;
  PassStats stats;

  InitPassStats(enc, &stats);
  ResetTokenStats(enc);

  // Fast mode: quick analysis pass over few mbs. Better than nothing.
  if (fast_probe) {
    if (method == 3) {  // we need more stats for method 3 to be reliable.
      nb_mbs = (nb_mbs > 200) ? nb_mbs >> 1 : 100;
    } else {
      nb_mbs = (nb_mbs > 200) ? nb_mbs >> 2 : 50;
    }
  }

  while (num_pass_left-- > 0) {
    const int is_last_pass = (fabs(stats.dq) <= DQ_LIMIT) ||
                             (num_pass_left == 0) ||
                             (enc->max_i4_header_bits == 0);
    const uint64_t size_p0 =
        OneStatPass(enc, rd_opt, nb_mbs, percent_per_pass, &stats);
    if (size_p0 == 0) return 0;
#if (DEBUG_SEARCH > 0)
    printf("#%d value:%.1lf -> %.1lf   q:%.2f -> %.2f\n",
           num_pass_left, stats.last_value, stats.value, stats.last_q, stats.q);
#endif
    if (enc->max_i4_header_bits > 0 && size_p0 > PARTITION0_SIZE_LIMIT) {
      ++num_pass_left;
      enc->max_i4_header_bits >>= 1;   // strengthen header bit limitation...
      continue;                        // ...and start over
    }
    if (is_last_pass) {
      break;
    }
    // If no target size: just do several pass without changing 'q'
    if (do_search) {
      ComputeNextQ(&stats);
      if (fabs(stats.dq) <= DQ_LIMIT) break;
    }
  }
  if (!do_search || !stats.do_size_search) {
    // Need to finalize probas now, since it wasn't done during the search.
    FinalizeSkipProba(enc);
    FinalizeTokenProbas(&enc->proba);
  }
  VP8CalculateLevelCosts(&enc->proba);  // finalize costs
  return WebPReportProgress(enc->pic, final_percent, &enc->percent);
}